

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O2

void qpdflogger_set_save(qpdflogger_handle l,qpdf_log_dest_e dest,qpdf_log_fn_t fn,void *udata,
                        int only_if_not_set)

{
  QPDFLogger *l_00;
  function<void_(std::shared_ptr<Pipeline>)> fStack_68;
  _Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool)>_(QPDFLogger_*,_std::_Placeholder<1>,_int)>
  local_48;
  
  l_00 = (l->l).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._M_f.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool),_true>.
  _M_pmf = (offset_in_QPDFLogger_to_subr)QPDFLogger::setSave;
  local_48._M_f.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>,_bool),_true>.
  _8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>,_int>.
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Tuple_impl<2UL,_int>)(_Tuple_impl<2UL,_int>)only_if_not_set;
  local_48._M_bound_args.super__Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>,_int>.
  super__Head_base<0UL,_QPDFLogger_*,_false>._M_head_impl = l_00;
  std::function<void(std::shared_ptr<Pipeline>)>::
  function<std::_Bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>,bool)>(QPDFLogger*,std::_Placeholder<1>,int)>&,void>
            ((function<void(std::shared_ptr<Pipeline>)> *)&fStack_68,&local_48);
  set_log_dest(l_00,&fStack_68,dest,"save logger",fn,udata);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  return;
}

Assistant:

void
qpdflogger_set_save(
    qpdflogger_handle l, qpdf_log_dest_e dest, qpdf_log_fn_t fn, void* udata, int only_if_not_set)
{
    auto method = std::bind(
        std::mem_fn(&QPDFLogger::setSave), l->l.get(), std::placeholders::_1, only_if_not_set);
    set_log_dest(l->l.get(), method, dest, "save logger", fn, udata);
}